

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyCleanDocument(TidyDocImpl *doc)

{
  Lexer *lexer;
  Lexer *lexer_00;
  TagStyle *pTVar1;
  Node *pNVar2;
  AttVal *pAVar3;
  tmbstr ptVar4;
  Node *pNVar5;
  TagStyle **ppTVar6;
  tmbstr str;
  ctmbstr local_40;
  
  CleanTree(doc,&doc->root);
  if (*(int *)((doc->config).value + 0x30) != 0) {
    DefineStyleRules(doc,&doc->root);
    lexer = doc->lexer;
    if (lexer->styles == (TagStyle *)0x0) {
      pNVar2 = prvTidyFindBody(doc);
      if (pNVar2 == (Node *)0x0) {
        return;
      }
      pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_BACKGROUND);
      if (((((pAVar3 == (AttVal *)0x0) &&
            (pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_BGCOLOR), pAVar3 == (AttVal *)0x0)) &&
           (pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_TEXT), pAVar3 == (AttVal *)0x0)) &&
          ((pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_LINK), pAVar3 == (AttVal *)0x0 &&
           (pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_VLINK), pAVar3 == (AttVal *)0x0)))) &&
         (pAVar3 = prvTidyAttrGetById(pNVar2,TidyAttr_ALINK), pAVar3 == (AttVal *)0x0)) {
        return;
      }
      *(byte *)&doc->badLayout = (byte)doc->badLayout | 0x10;
    }
    pNVar2 = prvTidyNewNode(doc->allocator,lexer);
    pNVar2->type = StartTag;
    pNVar2->implicit = yes;
    ptVar4 = prvTidytmbstrdup(doc->allocator,"style");
    pNVar2->element = ptVar4;
    prvTidyFindTag(doc,pNVar2);
    pAVar3 = prvTidyNewAttributeEx(doc,"type","text/css",0x22);
    prvTidyInsertAttributeAtStart(pNVar2,pAVar3);
    pNVar5 = prvTidyFindBody(doc);
    lexer->txtstart = lexer->lexsize;
    if (pNVar5 != (Node *)0x0) {
      lexer_00 = doc->lexer;
      pAVar3 = prvTidyAttrGetById(pNVar5,TidyAttr_BACKGROUND);
      if (pAVar3 == (AttVal *)0x0) {
        ptVar4 = (ctmbstr)0x0;
      }
      else {
        ptVar4 = pAVar3->value;
        pAVar3->value = (tmbstr)0x0;
        prvTidyRemoveAttribute(doc,pNVar5,pAVar3);
      }
      pAVar3 = prvTidyAttrGetById(pNVar5,TidyAttr_BGCOLOR);
      if (pAVar3 == (AttVal *)0x0) {
        str = (ctmbstr)0x0;
      }
      else {
        str = pAVar3->value;
        pAVar3->value = (tmbstr)0x0;
        prvTidyRemoveAttribute(doc,pNVar5,pAVar3);
      }
      pAVar3 = prvTidyAttrGetById(pNVar5,TidyAttr_TEXT);
      if (pAVar3 == (AttVal *)0x0) {
        local_40 = (ctmbstr)0x0;
      }
      else {
        local_40 = pAVar3->value;
        pAVar3->value = (tmbstr)0x0;
        prvTidyRemoveAttribute(doc,pNVar5,pAVar3);
      }
      if (((ptVar4 != (ctmbstr)0x0) || (str != (ctmbstr)0x0)) || (local_40 != (ctmbstr)0x0)) {
        prvTidyAddStringLiteral(lexer_00," body {\n");
        if (ptVar4 != (ctmbstr)0x0) {
          prvTidyAddStringLiteral(lexer_00,"  background-image: url(");
          prvTidyAddStringLiteral(lexer_00,ptVar4);
          prvTidyAddStringLiteral(lexer_00,");\n");
          (*doc->allocator->vtbl->free)(doc->allocator,ptVar4);
        }
        if (str != (ctmbstr)0x0) {
          prvTidyAddStringLiteral(lexer_00,"  background-color: ");
          prvTidyAddStringLiteral(lexer_00,str);
          prvTidyAddStringLiteral(lexer_00,";\n");
          (*doc->allocator->vtbl->free)(doc->allocator,str);
        }
        if (local_40 != (ctmbstr)0x0) {
          prvTidyAddStringLiteral(lexer_00,"  color: ");
          prvTidyAddStringLiteral(lexer_00,local_40);
          prvTidyAddStringLiteral(lexer_00,";\n");
          (*doc->allocator->vtbl->free)(doc->allocator,local_40);
        }
        prvTidyAddStringLiteral(lexer_00," }\n");
      }
      pAVar3 = prvTidyAttrGetById(pNVar5,TidyAttr_LINK);
      if (pAVar3 != (AttVal *)0x0) {
        AddColorRule(lexer_00," :link",pAVar3->value);
        prvTidyRemoveAttribute(doc,pNVar5,pAVar3);
      }
      pAVar3 = prvTidyAttrGetById(pNVar5,TidyAttr_VLINK);
      if (pAVar3 != (AttVal *)0x0) {
        AddColorRule(lexer_00," :visited",pAVar3->value);
        prvTidyRemoveAttribute(doc,pNVar5,pAVar3);
      }
      pAVar3 = prvTidyAttrGetById(pNVar5,TidyAttr_ALINK);
      if (pAVar3 != (AttVal *)0x0) {
        AddColorRule(lexer_00," :active",pAVar3->value);
        prvTidyRemoveAttribute(doc,pNVar5,pAVar3);
      }
    }
    ppTVar6 = &lexer->styles;
    while (pTVar1 = *ppTVar6, pTVar1 != (TagStyle *)0x0) {
      prvTidyAddCharToLexer(lexer,0x20);
      prvTidyAddStringLiteral(lexer,pTVar1->tag);
      prvTidyAddCharToLexer(lexer,0x2e);
      prvTidyAddStringLiteral(lexer,pTVar1->tag_class);
      prvTidyAddCharToLexer(lexer,0x20);
      prvTidyAddCharToLexer(lexer,0x7b);
      prvTidyAddStringLiteral(lexer,pTVar1->properties);
      prvTidyAddCharToLexer(lexer,0x7d);
      prvTidyAddCharToLexer(lexer,10);
      ppTVar6 = &pTVar1->next;
    }
    lexer->txtend = lexer->lexsize;
    pNVar5 = prvTidyTextToken(lexer);
    prvTidyInsertNodeAtEnd(pNVar2,pNVar5);
    pNVar5 = prvTidyFindHEAD(doc);
    if (pNVar5 != (Node *)0x0) {
      prvTidyInsertNodeAtEnd(pNVar5,pNVar2);
      return;
    }
  }
  return;
}

Assistant:

void TY_(CleanDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanTree( doc, &doc->root );

    if ( cfgBool(doc, TidyMakeClean) )
    {
        DefineStyleRules( doc, &doc->root );
        CreateStyleElement( doc );
    }
}